

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char,char&>(string *__return_storage_ptr__,char *a,char *b)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_c0;
  cmAlphaNum local_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_50;
  string_view local_38;
  string *local_28;
  
  local_88.Digits_[0] = *a;
  local_88.View_._M_str = local_88.Digits_;
  local_88.RValueString_ = (string *)0x0;
  local_88.View_._M_len = 1;
  local_50.first = cmAlphaNum::View(&local_88);
  local_50.second = local_88.RValueString_;
  local_c0.Digits_[0] = *b;
  local_c0.View_._M_str = local_c0.Digits_;
  local_c0.RValueString_ = (string *)0x0;
  local_c0.View_._M_len = 1;
  local_38 = cmAlphaNum::View(&local_c0);
  local_28 = local_c0.RValueString_;
  views._M_len = 2;
  views._M_array = &local_50;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}